

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BufferVariableTestGroup::init
          (BufferVariableTestGroup *this,EVP_PKEY_CTX *ctx)

{
  ContextType type;
  GLSLVersion glslVersion_00;
  int extraout_EAX;
  RenderContext *pRVar1;
  TestCaseGroup *pTVar2;
  TestCaseGroup *blockGroup_12;
  TestCaseGroup *blockGroup_11;
  TestCaseGroup *blockGroup_10;
  TestCaseGroup *blockGroup_9;
  TestCaseGroup *blockGroup_8;
  TestCaseGroup *blockGroup_7;
  TestCaseGroup *blockGroup_6;
  TestCaseGroup *blockGroup_5;
  TestCaseGroup *blockGroup_4;
  TestCaseGroup *blockGroup_3;
  TestCaseGroup *blockGroup_2;
  TestCaseGroup *blockGroup_1;
  TestCaseGroup *blockGroup;
  GLSLVersion glslVersion;
  BufferVariableTestGroup *this_local;
  
  pRVar1 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  glslVersion_00 = glu::getContextTypeGLSLVersion(type);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"resource_list","Resource list");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableResourceListBlockContentsProxy);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"array_size","Array size");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"array_stride","Array stride");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)4>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"block_index","Block index");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBlockIndexCases
            ((this->super_TestCaseGroup).m_context,glslVersion_00,(TestCaseGroup *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"is_row_major","Is row major");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableMatrixCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)64>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"matrix_stride","Matrix stride");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableMatrixCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)128>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"name_length","Name length");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableNameLengthCases);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(this->super_TestCaseGroup).m_context,"offset","Offset");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableOffsetCases);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"referenced_by","Referenced by");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateReferencedByShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableReferencedByBlockContents);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"top_level_array_size",
             "Top-level array size");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)32768>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"top_level_array_stride",
             "Top-level array stride");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)65536>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(this->super_TestCaseGroup).m_context,"type","Type");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableTypeBlock
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(this->super_TestCaseGroup).m_context,"random","Random");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableRandomCases
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00);
  return extraout_EAX;
}

Assistant:

void BufferVariableTestGroup::init (void)
{
	const glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	// .resource_list
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "resource_list", "Resource list");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableResourceListBlockContentsProxy);
	}

	// .array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_size", "Array size");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableArrayCases<PROGRAMRESOURCEPROP_ARRAY_SIZE>);
	}

	// .array_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_stride", "Array stride");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableArrayCases<PROGRAMRESOURCEPROP_ARRAY_STRIDE>);
	}

	// .block_index
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "block_index", "Block index");
		addChild(blockGroup);
		generateBufferVariableBlockIndexCases(m_context, glslVersion, blockGroup);
	}

	// .is_row_major
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "is_row_major", "Is row major");
		addChild(blockGroup);
		generateBufferVariableMatrixCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableMatrixCases<PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR>);
	}

	// .matrix_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "matrix_stride", "Matrix stride");
		addChild(blockGroup);
		generateBufferVariableMatrixCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableMatrixCases<PROGRAMRESOURCEPROP_MATRIX_STRIDE>);
	}

	// .name_length
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "name_length", "Name length");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableNameLengthCases);
	}

	// .offset
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "offset", "Offset");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableOffsetCases);
	}

	// .referenced_by
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "referenced_by", "Referenced by");
		addChild(blockGroup);
		generateReferencedByShaderCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableReferencedByBlockContents);
	}

	// .top_level_array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "top_level_array_size", "Top-level array size");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableTopLevelCases<PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE>);
	}

	// .top_level_array_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "top_level_array_stride", "Top-level array stride");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableTopLevelCases<PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_STRIDE>);
	}

	// .type
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "type", "Type");
		addChild(blockGroup);
		generateBufferVariableTypeBlock(m_context, blockGroup, glslVersion);
	}

	// .random
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "random", "Random");
		addChild(blockGroup);
		generateBufferVariableRandomCases(m_context, blockGroup, glslVersion);
	}
}